

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

uint8_t * __thiscall arangodb::velocypack::Builder::add(Builder *this,ArrayIterator *sub)

{
  arena_type *paVar1;
  bool bVar2;
  reference pvVar3;
  undefined8 uVar4;
  ArrayIterator *in_RSI;
  ArrayIterator *in_RDI;
  ValueLength oldPos;
  ValueLength pos;
  ArrayIterator *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar5;
  
  bVar2 = std::
          vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
          ::empty((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_RDI);
  if (bVar2) {
    uVar4 = __cxa_allocate_exception(0x18);
    Exception::Exception
              ((Exception *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               (ExceptionType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
  }
  pvVar3 = std::
           vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ::back((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  uVar5 = false;
  if (*(char *)((long)&((pointer)in_RDI->_position)->startPos + pvVar3->startPos) != '\x06') {
    uVar5 = *(char *)((long)&((pointer)in_RDI->_position)->startPos + pvVar3->startPos) != '\x13';
  }
  if ((bool)uVar5 == false) {
    paVar1 = (((_Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                *)&in_RDI[1]._slice)->_M_impl).super__Tp_alloc_type.a_;
    uVar5 = 0;
    while( true ) {
      bVar2 = ArrayIterator::valid(in_RSI);
      if (!bVar2) break;
      ArrayIterator::operator*(in_stack_ffffffffffffffb8);
      add((Builder *)CONCAT17(uVar5,in_stack_ffffffffffffffc0),&in_stack_ffffffffffffffb8->_slice);
      ArrayIterator::next(in_RDI);
    }
    return (uint8_t *)((long)&((pointer)in_RDI->_position)->startPos + (long)paVar1);
  }
  uVar4 = __cxa_allocate_exception(0x18);
  Exception::Exception
            ((Exception *)CONCAT17(uVar5,in_stack_ffffffffffffffc0),
             (ExceptionType)((ulong)uVar4 >> 0x20));
  __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t* Builder::add(ArrayIterator&& sub) {
  if (VELOCYPACK_UNLIKELY(_stack.empty())) {
    throw Exception(Exception::BuilderNeedOpenArray);
  }
  ValueLength const pos = _stack.back().startPos;
  if (VELOCYPACK_UNLIKELY(_start[pos] != 0x06 && _start[pos] != 0x13)) {
    throw Exception(Exception::BuilderNeedOpenArray);
  }
  auto const oldPos = _pos;
  while (sub.valid()) {
    add(*sub);
    sub.next();
  }
  return _start + oldPos;
}